

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_test.cpp
# Opt level: O2

void __thiscall Image_PfmIO_Test::TestBody(Image_PfmIO_Test *this)

{
  RGBColorSpace *expected;
  bool bVar1;
  Allocator alloc;
  RGBColorSpace *actual;
  ulong uVar2;
  int c;
  int iVar3;
  long lVar4;
  char *pcVar5;
  char *in_R9;
  Point2i p;
  Float FVar6;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  channels;
  AssertHelper local_418;
  AssertionResult gtest_ar_;
  AssertionResult gtest_ar;
  allocator<char> local_3d9;
  long local_3d8;
  ulong local_3d0;
  ulong local_3c8;
  WrapMode2D local_3c0;
  WrapMode2D local_3b8;
  ColorEncodingHandle local_3b0;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> local_3a8;
  vector<float,_pstd::pmr::polymorphic_allocator<float>_> rgbPixels;
  ImageAndMetadata read;
  Image image;
  
  GetFloatPixels(&rgbPixels,(Point2i)0x3100000010,3);
  gtest_ar._0_8_ = pstd::pmr::new_delete_resource();
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::vector
            (&local_3a8,&rgbPixels,(polymorphic_allocator<float> *)&gtest_ar);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&read,"R",(allocator<char> *)&gtest_ar_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)read.image.channelNames.field_2.fixed,"G",(allocator<char> *)&local_418);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)(read.image.channelNames.field_2.fixed + 1),"B",&local_3d9);
  channels.n = 3;
  channels.ptr = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&read;
  pbrt::Image::Image(&image,&local_3a8,(Point2i)0x3100000010,channels);
  lVar4 = 0x40;
  do {
    std::__cxx11::string::~string((string *)((long)&read.image.format + lVar4));
    lVar4 = lVar4 + -0x20;
  } while (lVar4 != -0x20);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&local_3a8);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"test.pfm",(allocator<char> *)&local_418);
  read.image.p16.nAlloc = (size_t)&read.image.p16;
  read.image.p8.ptr = (uchar *)0x0;
  read.image.p8.nAlloc = 0;
  read.image.p8.nStored = 0;
  read.image.p16.alloc.memoryResource = (memory_resource *)0x0;
  read.image.p16.ptr = (Half *)0x0;
  read.image.channelNames.field_2.fixed[3]._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  read.image.channelNames.field_2.fixed[3]._M_string_length = 0;
  read.image.channelNames.field_2._112_8_ = 0;
  read.image.channelNames.field_2._120_8_ = 0;
  read.image.channelNames.nAlloc = 0;
  read.image.channelNames.nStored = 0;
  read.image.encoding.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  read.image.p8.alloc.memoryResource = (memory_resource *)0x0;
  read.image.channelNames.field_2.fixed[1]._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  read.image.channelNames.field_2.fixed[1]._M_string_length = 0;
  read.image.channelNames.field_2._48_8_ = 0;
  read.image.channelNames.field_2._56_8_ = 0;
  read.image.channelNames.field_2.fixed[2]._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  read.image.channelNames.field_2.fixed[2]._M_string_length = 0;
  read.image.channelNames.field_2._80_8_ = 0;
  read.image.channelNames.field_2._88_8_ = 0;
  read.image.format = U256;
  read.image.resolution.super_Tuple2<pbrt::Point2,_int>.x = 0;
  read.image.resolution.super_Tuple2<pbrt::Point2,_int>.y = 0;
  read.image._12_4_ = 0;
  read.image.channelNames.alloc.memoryResource = (memory_resource *)0x0;
  read.image.channelNames.ptr =
       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  read.image.channelNames.field_2.fixed[0]._M_dataplus._M_p = (_Alloc_hider)(pointer)0x0;
  read.image.channelNames.field_2.fixed[0]._M_string_length = 0;
  read.image.channelNames.field_2._16_8_ = 0;
  read.image.channelNames.field_2._24_8_ = 0;
  read.image.p32.alloc.memoryResource = (memory_resource *)0x0;
  read.image.p16.nStored = read.image.p16.nAlloc;
  bVar1 = pbrt::Image::Write(&image,(string *)&gtest_ar,(ImageMetadata *)&read);
  gtest_ar_.success_ = bVar1;
  gtest_ar_.message_.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0
  ;
  pbrt::ImageMetadata::~ImageMetadata((ImageMetadata *)&read);
  std::__cxx11::string::~string((string *)&gtest_ar);
  if (gtest_ar_.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              ((string *)&read,(internal *)&gtest_ar_,(AssertionResult *)"image.Write(\"test.pfm\")"
               ,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x136,(char *)CONCAT44(read.image.resolution.super_Tuple2<pbrt::Point2,_int>.x,
                                       read.image.format));
    testing::internal::AssertHelper::operator=(&local_418,(Message *)&gtest_ar);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    std::__cxx11::string::~string((string *)&read);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar_.message_);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&gtest_ar,"test.pfm",(allocator<char> *)&gtest_ar_);
  alloc.memoryResource = pstd::pmr::new_delete_resource();
  local_3b0.
  super_TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>.
  bits = (TaggedPointer<pbrt::LinearColorEncoding,_pbrt::sRGBColorEncoding,_pbrt::GammaColorEncoding>
          )0;
  pbrt::Image::Read(&read,(string *)&gtest_ar,alloc,&local_3b0);
  std::__cxx11::string::~string((string *)&gtest_ar);
  expected = pbrt::RGBColorSpace::sRGB;
  actual = pbrt::ImageMetadata::GetColorSpace(&read.metadata);
  testing::internal::CmpHelperEQ<pbrt::RGBColorSpace,pbrt::RGBColorSpace>
            ((internal *)&gtest_ar,"*RGBColorSpace::sRGB","*read.metadata.GetColorSpace()",expected,
             actual);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x138,pcVar5);
    testing::internal::AssertHelper::operator=(&local_418,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  local_418.data_ =
       (AssertHelperData *)
       CONCAT44(read.image.resolution.super_Tuple2<pbrt::Point2,_int>.y,
                read.image.resolution.super_Tuple2<pbrt::Point2,_int>.x);
  gtest_ar_._0_8_ = image.resolution.super_Tuple2<pbrt::Point2,_int>;
  testing::internal::CmpHelperEQ<pbrt::Point2<int>,pbrt::Point2<int>>
            ((internal *)&gtest_ar,"image.Resolution()","read.image.Resolution()",
             (Point2<int> *)&gtest_ar_,(Point2<int> *)&local_418);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x13a,pcVar5);
    testing::internal::AssertHelper::operator=(&local_418,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_._0_4_ = 2;
  local_418.data_._0_4_ = (Float)read.image.format;
  testing::internal::CmpHelperEQ<pbrt::PixelFormat,pbrt::PixelFormat>
            ((internal *)&gtest_ar,"PixelFormat::Float","read.image.Format()",
             (PixelFormat *)&gtest_ar_,(PixelFormat *)&local_418);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x13b,pcVar5);
    testing::internal::AssertHelper::operator=(&local_418,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  gtest_ar_._0_4_ = 3;
  local_418.data_._0_4_ = (Float)(undefined4)read.image.channelNames.nStored;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"3","read.image.NChannels()",(int *)&gtest_ar_,(int *)&local_418)
  ;
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x13c,pcVar5);
    testing::internal::AssertHelper::operator=(&local_418,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  lVar4 = 0;
  while (lVar4 != 0x31) {
    local_3d0 = lVar4 << 0x20;
    uVar2 = 0;
    local_3d8 = lVar4;
    while (uVar2 != 0x10) {
      p.super_Tuple2<pbrt::Point2,_int> = (Tuple2<pbrt::Point2,_int>)(local_3d0 | uVar2);
      local_3c8 = uVar2;
      for (iVar3 = 0; iVar3 != 3; iVar3 = iVar3 + 1) {
        pbrt::WrapMode2D::WrapMode2D(&local_3b8,Clamp);
        FVar6 = pbrt::Image::GetChannel(&image,p,iVar3,local_3b8);
        gtest_ar_._0_4_ = FVar6;
        pbrt::WrapMode2D::WrapMode2D(&local_3c0,Clamp);
        FVar6 = pbrt::Image::GetChannel(&read.image,p,iVar3,local_3c0);
        local_418.data_._0_4_ = FVar6;
        testing::internal::CmpHelperEQ<float,float>
                  ((internal *)&gtest_ar,"image.GetChannel({x, y}, c)",
                   "read.image.GetChannel({x, y}, c)",(float *)&gtest_ar_,(float *)&local_418);
        if (gtest_ar.success_ == false) {
          testing::Message::Message((Message *)&gtest_ar_);
          pcVar5 = "";
          if (gtest_ar.message_.ptr_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_418,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
                     ,0x141,pcVar5);
          testing::internal::AssertHelper::operator=(&local_418,(Message *)&gtest_ar_);
          testing::internal::AssertHelper::~AssertHelper(&local_418);
          testing::internal::
          scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                         *)&gtest_ar_);
        }
        testing::internal::
        scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::~scoped_ptr(&gtest_ar.message_);
      }
      uVar2 = local_3c8 + 1;
    }
    lVar4 = local_3d8 + 1;
  }
  gtest_ar_._0_8_ = gtest_ar_._0_8_ & 0xffffffff00000000;
  iVar3 = remove("test.pfm");
  local_418.data_._0_4_ = (Float)iVar3;
  testing::internal::CmpHelperEQ<int,int>
            ((internal *)&gtest_ar,"0","remove(\"test.pfm\")",(int *)&gtest_ar_,(int *)&local_418);
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)&gtest_ar_);
    if (gtest_ar.message_.ptr_ ==
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      pcVar5 = "";
    }
    else {
      pcVar5 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_418,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/util/image_test.cpp"
               ,0x143,pcVar5);
    testing::internal::AssertHelper::operator=(&local_418,(Message *)&gtest_ar_);
    testing::internal::AssertHelper::~AssertHelper(&local_418);
    testing::internal::
    scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~scoped_ptr((scoped_ptr<std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_>
                   *)&gtest_ar_);
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  ~scoped_ptr(&gtest_ar.message_);
  pbrt::ImageAndMetadata::~ImageAndMetadata(&read);
  pbrt::Image::~Image(&image);
  pstd::vector<float,_pstd::pmr::polymorphic_allocator<float>_>::~vector(&rgbPixels);
  return;
}

Assistant:

TEST(Image, PfmIO) {
    Point2i res(16, 49);
    pstd::vector<float> rgbPixels = GetFloatPixels(res, 3);

    Image image(rgbPixels, res, {"R", "G", "B"});
    EXPECT_TRUE(image.Write("test.pfm"));
    ImageAndMetadata read = Image::Read("test.pfm");
    EXPECT_EQ(*RGBColorSpace::sRGB, *read.metadata.GetColorSpace());

    EXPECT_EQ(image.Resolution(), read.image.Resolution());
    EXPECT_EQ(PixelFormat::Float, read.image.Format());
    EXPECT_EQ(3, read.image.NChannels());

    for (int y = 0; y < res[1]; ++y)
        for (int x = 0; x < res[0]; ++x)
            for (int c = 0; c < 3; ++c)
                EXPECT_EQ(image.GetChannel({x, y}, c), read.image.GetChannel({x, y}, c));

    EXPECT_EQ(0, remove("test.pfm"));
}